

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *brand)

{
  ListElementCount LVar1;
  bool local_151;
  IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
  local_150;
  IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
  local_140;
  Fault f;
  DebugExpression<bool_&> local_128;
  Reader scope;
  Reader type;
  Reader binding;
  Reader local_90;
  Reader local_60;
  
  capnp::schema::Brand::Reader::getScopes(&local_60,brand);
  local_140.index = 0;
  local_140.container = &local_60;
  do {
    if (local_140.index == local_60.reader.elementCount) {
      return;
    }
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
    ::operator*(&scope,&local_140);
    if ((scope._reader.dataSize < 0x50) || (*(short *)((long)scope._reader.data + 8) == 0)) {
      capnp::schema::Brand::Scope::Reader::getBind(&local_90,&scope);
      LVar1 = local_90.reader.elementCount;
      local_150.container = &local_90;
      for (local_150.index = 0; local_150.index != LVar1; local_150.index = local_150.index + 1) {
        _::
        IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
        ::operator*(&binding,&local_150);
        if ((0xf < binding._reader.dataSize) && (*binding._reader.data == 1)) {
          capnp::schema::Brand::Binding::Reader::getType(&type,&binding);
          validate(this,&type);
          if ((type._reader.dataSize < 0x10) ||
             ((*type._reader.data < 0x10 && ((0x8fffU >> (*type._reader.data & 0x1f) & 1) != 0)))) {
            local_128.value = &local_151;
            local_151 = false;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&,char_const(&)[46],capnp::schema::Type::Reader&>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                       ,0x24d,FAILED,"isPointer",
                       "_kjCondition,\"generic type parameter must be a pointer type\", type",
                       &local_128,(char (*) [46])"generic type parameter must be a pointer type",
                       &type);
            this->isValid = false;
            kj::_::Debug::Fault::~Fault(&f);
            return;
          }
        }
      }
    }
    local_140.index = local_140.index + 1;
  } while( true );
}

Assistant:

void validate(const schema::Brand::Reader& brand) {
    for (auto scope: brand.getScopes()) {
      switch (scope.which()) {
        case schema::Brand::Scope::BIND:
          for (auto binding: scope.getBind()) {
            switch (binding.which()) {
              case schema::Brand::Binding::UNBOUND:
                break;
              case schema::Brand::Binding::TYPE: {
                auto type = binding.getType();
                validate(type);
                bool isPointer = true;
                switch (type.which()) {
                  case schema::Type::VOID:
                  case schema::Type::BOOL:
                  case schema::Type::INT8:
                  case schema::Type::INT16:
                  case schema::Type::INT32:
                  case schema::Type::INT64:
                  case schema::Type::UINT8:
                  case schema::Type::UINT16:
                  case schema::Type::UINT32:
                  case schema::Type::UINT64:
                  case schema::Type::FLOAT32:
                  case schema::Type::FLOAT64:
                  case schema::Type::ENUM:
                    isPointer = false;
                    break;

                  case schema::Type::TEXT:
                  case schema::Type::DATA:
                  case schema::Type::ANY_POINTER:
                  case schema::Type::STRUCT:
                  case schema::Type::INTERFACE:
                  case schema::Type::LIST:
                    isPointer = true;
                    break;
                }
                VALIDATE_SCHEMA(isPointer,
                    "generic type parameter must be a pointer type", type);

                break;
              }
            }
          }
          break;
        case schema::Brand::Scope::INHERIT:
          break;
      }
    }
  }